

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

bool __thiscall spvc_resources_s::copy_resources(spvc_resources_s *this,ShaderResources *resources)

{
  bool bVar1;
  
  bVar1 = copy_resources(this,&this->uniform_buffers,&resources->uniform_buffers);
  if (bVar1) {
    bVar1 = copy_resources(this,&this->storage_buffers,&resources->storage_buffers);
    if (bVar1) {
      bVar1 = copy_resources(this,&this->stage_inputs,&resources->stage_inputs);
      if (bVar1) {
        bVar1 = copy_resources(this,&this->stage_outputs,&resources->stage_outputs);
        if (bVar1) {
          bVar1 = copy_resources(this,&this->subpass_inputs,&resources->subpass_inputs);
          if (bVar1) {
            bVar1 = copy_resources(this,&this->storage_images,&resources->storage_images);
            if (bVar1) {
              bVar1 = copy_resources(this,&this->sampled_images,&resources->sampled_images);
              if (bVar1) {
                bVar1 = copy_resources(this,&this->atomic_counters,&resources->atomic_counters);
                if (bVar1) {
                  bVar1 = copy_resources(this,&this->push_constant_buffers,
                                         &resources->push_constant_buffers);
                  if (bVar1) {
                    bVar1 = copy_resources(this,&this->shader_record_buffers,
                                           &resources->shader_record_buffers);
                    if (bVar1) {
                      bVar1 = copy_resources(this,&this->separate_images,&resources->separate_images
                                            );
                      if (bVar1) {
                        bVar1 = copy_resources(this,&this->separate_samplers,
                                               &resources->separate_samplers);
                        if (bVar1) {
                          bVar1 = copy_resources(this,&this->acceleration_structures,
                                                 &resources->acceleration_structures);
                          if (bVar1) {
                            bVar1 = copy_resources(this,&this->gl_plain_uniforms,
                                                   &resources->gl_plain_uniforms);
                            if (bVar1) {
                              bVar1 = copy_resources(this,&this->builtin_inputs,
                                                     &resources->builtin_inputs);
                              if (bVar1) {
                                bVar1 = copy_resources(this,&this->builtin_outputs,
                                                       &resources->builtin_outputs);
                                return bVar1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool spvc_resources_s::copy_resources(const ShaderResources &resources)
{
	if (!copy_resources(uniform_buffers, resources.uniform_buffers))
		return false;
	if (!copy_resources(storage_buffers, resources.storage_buffers))
		return false;
	if (!copy_resources(stage_inputs, resources.stage_inputs))
		return false;
	if (!copy_resources(stage_outputs, resources.stage_outputs))
		return false;
	if (!copy_resources(subpass_inputs, resources.subpass_inputs))
		return false;
	if (!copy_resources(storage_images, resources.storage_images))
		return false;
	if (!copy_resources(sampled_images, resources.sampled_images))
		return false;
	if (!copy_resources(atomic_counters, resources.atomic_counters))
		return false;
	if (!copy_resources(push_constant_buffers, resources.push_constant_buffers))
		return false;
	if (!copy_resources(shader_record_buffers, resources.shader_record_buffers))
		return false;
	if (!copy_resources(separate_images, resources.separate_images))
		return false;
	if (!copy_resources(separate_samplers, resources.separate_samplers))
		return false;
	if (!copy_resources(acceleration_structures, resources.acceleration_structures))
		return false;
	if (!copy_resources(gl_plain_uniforms, resources.gl_plain_uniforms))
		return false;
	if (!copy_resources(builtin_inputs, resources.builtin_inputs))
		return false;
	if (!copy_resources(builtin_outputs, resources.builtin_outputs))
		return false;

	return true;
}